

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::addOutput
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr spec)

{
  size_t __n;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> **ppRVar1;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar2;
  String *pSVar3;
  String *pSVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  CompilerMain *pCVar7;
  int iVar8;
  void *pvVar9;
  undefined4 extraout_var;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar10;
  char *__s;
  long lVar11;
  char *__file;
  ulong uVar12;
  size_t sVar13;
  StringPtr pathText;
  stat stats;
  Path local_168;
  CompilerMain *local_148;
  String local_140;
  String *local_128;
  size_t sStack_120;
  ArrayDisposer *local_118;
  undefined1 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ArrayDisposer *local_f8;
  undefined1 local_f0;
  PathPtr local_d0;
  stat local_c0;
  
  __s = spec.content.ptr;
  __n = spec.content.size_ - 1;
  pvVar9 = memchr(__s,0x3a,__n);
  if (pvVar9 == (void *)0x0) {
    local_f0 = 0;
    local_c0.st_nlink._0_1_ = 0;
    pRVar10 = (this->outputs).builder.pos;
    local_c0.st_dev = (__dev_t)__s;
    local_c0.st_ino = __n;
    if (pRVar10 == (this->outputs).builder.endPtr) {
      pRVar2 = (this->outputs).builder.ptr;
      sVar13 = 4;
      if (pRVar10 != pRVar2) {
        sVar13 = ((long)pRVar10 - (long)pRVar2 >> 4) * 0x5555555555555556;
      }
      kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity(&this->outputs,sVar13)
      ;
      pRVar10 = (this->outputs).builder.pos;
    }
    (pRVar10->name).ptr = (char *)local_c0.st_dev;
    (pRVar10->name).size_ = local_c0.st_ino;
    (pRVar10->dir).ptr.isSet = false;
    ppRVar1 = &(this->outputs).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  else {
    sVar13 = (long)pvVar9 - (long)__s;
    __file = (char *)((long)pvVar9 + 1);
    uVar12 = ~sVar13 + spec.content.size_;
    local_148 = this;
    if (((sVar13 == 1) && (sVar13 = 1, 1 < uVar12)) && ((*__file == '/' || (*__file == '\\')))) {
      pvVar9 = memchr(__file,0x3a,uVar12 - 1);
      lVar11 = (long)pvVar9 + (1 - (long)__file);
      if (pvVar9 == (void *)0x0) {
        lVar11 = 0;
      }
      sVar13 = 1;
      if (pvVar9 != (void *)0x0) {
        sVar13 = (long)pvVar9 + (2 - (long)__file);
      }
      __file = __file + lVar11;
      uVar12 = uVar12 - lVar11;
    }
    iVar8 = stat(__file,&local_c0);
    if ((iVar8 < 0) || ((local_c0.st_mode & 0xf000) != 0x4000)) {
      kj::heapString(&local_140,"output location is inaccessible or is not a directory",0x35);
      (__return_storage_ptr__->errorMessage).ptr.isSet = true;
      (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = local_140.content.ptr;
      (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
           local_140.content.size_;
      (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
           (ArrayDisposer *)
           CONCAT71(local_140.content.disposer._1_7_,local_140.content.disposer._0_1_);
      return __return_storage_ptr__;
    }
    iVar8 = (*((local_148->disk).ptr)->_vptr_Filesystem[2])();
    local_d0.parts.ptr = (String *)CONCAT44(extraout_var,iVar8);
    pathText.content.size_ = uVar12;
    pathText.content.ptr = __file;
    kj::PathPtr::eval(&local_168,&local_d0,pathText);
    pCVar7 = local_148;
    pAVar6 = local_168.parts.disposer;
    sVar5 = local_168.parts.size_;
    pSVar3 = local_168.parts.ptr;
    local_110 = 1;
    local_f8 = local_168.parts.disposer;
    local_168.parts.ptr = (String *)0x0;
    local_168.parts.size_ = 0;
    local_140.content.disposer._0_1_ = 1;
    local_128 = pSVar3;
    sStack_120 = sVar5;
    local_118 = local_168.parts.disposer;
    local_108 = 0;
    uStack_100 = 0;
    pRVar10 = (local_148->outputs).builder.pos;
    local_140.content.ptr = __s;
    local_140.content.size_ = sVar13;
    if (pRVar10 == (local_148->outputs).builder.endPtr) {
      pRVar2 = (local_148->outputs).builder.ptr;
      sVar13 = 4;
      if (pRVar10 != pRVar2) {
        sVar13 = ((long)pRVar10 - (long)pRVar2 >> 4) * 0x5555555555555556;
      }
      kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity
                (&local_148->outputs,sVar13);
      pRVar10 = (pCVar7->outputs).builder.pos;
    }
    sVar13 = local_168.parts.size_;
    pSVar4 = local_168.parts.ptr;
    (pRVar10->name).ptr = local_140.content.ptr;
    (pRVar10->name).size_ = local_140.content.size_;
    (pRVar10->dir).ptr.isSet = true;
    (pRVar10->dir).ptr.field_1.value.parts.ptr = pSVar3;
    (pRVar10->dir).ptr.field_1.value.parts.size_ = sVar5;
    (pRVar10->dir).ptr.field_1.value.parts.disposer = pAVar6;
    local_128 = (String *)0x0;
    sStack_120 = 0;
    ppRVar1 = &(pCVar7->outputs).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
    if (local_168.parts.ptr != (String *)0x0) {
      local_168.parts.ptr = (String *)0x0;
      local_168.parts.size_ = 0;
      (**(local_168.parts.disposer)->_vptr_ArrayDisposer)
                (local_168.parts.disposer,pSVar4,0x18,sVar13,sVar13,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addOutput(kj::StringPtr spec) {
    KJ_IF_MAYBE(split, spec.findFirst(':')) {
      kj::StringPtr dir = spec.slice(*split + 1);
      auto plugin = spec.slice(0, *split);

      if (*split == 1 && (dir.startsWith("/") || dir.startsWith("\\"))) {
        // The colon is the second character and is immediately followed by a slash or backslash.
        // So, the user passed something like `-o c:/foo`. Is this a request to run the C plugin
        // and output to `/foo`? Or are we on Windows, and is this a request to run the plugin
        // `c:/foo`?
        KJ_IF_MAYBE(split2, dir.findFirst(':')) {
          // There are two colons. The first ':' was the second char, and was followed by '/' or
          // '\', e.g.:
          //     capnp compile -o c:/foo.exe:bar
          //
          // In this case we can conclude that the second colon is actually meant to be the
          // plugin/location separator, and the first colon was simply signifying a drive letter.
          //
          // Proof by contradiction:
          // - Say that none of the colons were meant to be plugin/location separators; i.e. the
          //   whole argument is meant to be a plugin indicator and the location defaults to ".".
          //   -> In this case, the plugin path has two colons, which is not valid.
          //   -> CONTRADICTION
          // - Say that the first colon was meant to be the plugin/location separator.
          //   -> In this case, the second colon must be the drive letter separator for the
          //      output location.
          //   -> However, the output location begins with '/' or '\', which is not a drive letter.
          //   -> CONTRADICTION
          // - Say that there are more colons beyond the first two, and one of these is meant to
          //   be the plugin/location separator.
          //   -> In this case, the plugin path has two or more colons, which is not valid.
          //   -> CONTRADICTION
          //
          // We therefore conclude that the *second* colon is in fact the plugin/location separator.

          dir = dir.slice(*split2 + 1);
          plugin = spec.slice(0, *split2 + 2);
#if _WIN32
        } else {
          // The user wrote something like:
          //
          //     capnp compile -o c:/foo/bar
          //
          // What does this mean? It depends on what system we're on. On a Unix system, the above
          // clearly is a request to run the `capnpc-c` plugin (perhaps to output C code) and write
          // to the directory /foo/bar. But on Windows, absolute paths do not start with '/', and
          // the above is actually a request to run the plugin `c:/foo/bar`, outputting to the
          // current directory.

          outputs.add(OutputDirective { spec.asArray(), nullptr });
          return true;
#endif
        }
      }

      struct stat stats;
      if (stat(dir.cStr(), &stats) < 0 || !S_ISDIR(stats.st_mode)) {
        return "output location is inaccessible or is not a directory";
      }
      outputs.add(OutputDirective { plugin, disk->getCurrentPath().evalNative(dir) });
    }